

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O2

int __thiscall Qclass::execute(Qclass *this)

{
  double dVar1;
  bool bVar2;
  Qclass *pQVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  double dVar11;
  long local_240;
  ofstream outfile;
  uint auStack_228 [123];
  int local_3c;
  Qclass *local_38;
  
  local_3c = this->goal_x * 0x32 + this->goal_y;
  local_38 = this;
  std::ofstream::ofstream(&local_240);
  std::ofstream::open((char *)&local_240,0x105127);
  poVar5 = std::operator<<((ostream *)&std::cout,"The path followed by the robot is:");
  std::endl<char,std::char_traits<char>>(poVar5);
  *(undefined8 *)(&outfile + *(long *)(local_240 + -0x18)) = 6;
  pQVar3 = local_38;
  iVar7 = 0x2f;
  uVar9 = 0;
  iVar10 = 0x2f;
  iVar4 = 5000;
  while (iVar4 != local_3c) {
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    *(uint *)((long)auStack_228 + *(long *)(local_240 + -0x18)) =
         *(uint *)((long)auStack_228 + *(long *)(local_240 + -0x18)) & 0xfffffefb | 4;
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_240,iVar10);
    poVar5 = std::operator<<(poVar5,"   ");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xfffffefb | 4;
    std::ostream::operator<<(poVar5,iVar7);
    std::endl<char,std::char_traits<char>>((ostream *)&local_240);
    iVar4 = iVar10 * 0x32 + iVar7;
    dVar11 = -10000.0;
    for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
      dVar1 = pQVar3->Q[iVar4][uVar6];
      bVar2 = dVar11 <= dVar1;
      dVar11 = (double)(-(ulong)(dVar1 < dVar11) & (ulong)dVar11 |
                       ~-(ulong)(dVar1 < dVar11) & (ulong)dVar1);
      if (bVar2) {
        uVar9 = uVar6 & 0xffffffff;
      }
    }
    iVar8 = (int)uVar9;
    pQVar3->Q[iVar4][iVar8] = -1000.0;
    iVar10 = (iVar10 + (uint)(iVar8 == 0)) - (uint)(iVar8 == 1);
    iVar7 = (iVar7 + (uint)(iVar8 == 2)) - (uint)(iVar8 == 3);
    iVar4 = iVar10 * 0x32 + iVar7;
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_38->goal_x);
  poVar5 = std::operator<<(poVar5,",");
  std::ostream::operator<<(poVar5,local_38->goal_y);
  *(uint *)((long)auStack_228 + *(long *)(local_240 + -0x18)) =
       *(uint *)((long)auStack_228 + *(long *)(local_240 + -0x18)) & 0xfffffefb | 4;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_240,local_38->goal_x);
  poVar5 = std::operator<<(poVar5,"   ");
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::ostream::operator<<(poVar5,local_38->goal_y);
  std::ofstream::close();
  std::ofstream::~ofstream(&local_240);
  return 0;
}

Assistant:

int Qclass::execute() {   // Executes the learned algorithm for given start
  int start_x = 47;
  int start_y = 47;
  int last_state = 5000;
  double max = -10000;
  int action = 0;
  int goal_state = findState(goal_x, goal_y);
  std::ofstream outfile;
  outfile.open("Co_ordinates.txt", std::ios::out | std::ios::trunc);
  std::cout << "The path followed by the robot is:" << std::endl;
  outfile.precision(6);
  while (last_state != goal_state) {
    int start_state;
    std::cout << start_x << "," << start_y << std::endl;
    outfile << std::fixed << start_x << "   " << std::fixed << start_y;
    outfile << std::endl;
    start_state = findState(start_x, start_y);
    for (int i = 0; i < 4; i++) {
      if (Q[start_state][i] >= max) {
        max = Q[start_state][i];
        action = i;
      }
    }
    Q[start_state][action] = -1000;
    if (action == 0) {
      start_x = start_x + 1;
    }
    if (action == 1) {
      start_x = start_x - 1;
    }
    if (action == 2) {
      start_y = start_y + 1;
    }
    if (action == 3) {
      start_y = start_y - 1;
    }
    last_state = findState(start_x, start_y);
    max = -10000;
  }
  std::cout << goal_x << "," << goal_y;
  outfile << std::fixed << goal_x << "   " << std::fixed << goal_y;
  outfile.close();
  return 0;
}